

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

void ensure_mv_buffer(RefCntBuffer *buf,AV1_COMMON *cm)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  long in_RSI;
  long in_RDI;
  int mem_size;
  CommonModeInfoParams *mi_params;
  int buf_cols;
  int buf_rows;
  int iVar4;
  int iVar5;
  
  iVar5 = *(int *)(in_RDI + 0x104);
  iVar4 = *(int *)(in_RDI + 0x108);
  pvVar2 = (void *)(in_RSI + 0x208);
  if (((*(long *)(in_RDI + 0x48) == 0) || (iVar5 != *(int *)(in_RSI + 0x214))) ||
     (iVar4 != *(int *)(in_RSI + 0x218))) {
    aom_free(pvVar2);
    *(undefined4 *)(in_RDI + 0x104) = *(undefined4 *)((long)pvVar2 + 0xc);
    *(undefined4 *)(in_RDI + 0x108) = *(undefined4 *)((long)pvVar2 + 0x10);
    pvVar3 = aom_calloc(CONCAT44(iVar5,iVar4),(size_t)pvVar2);
    *(void **)(in_RDI + 0x48) = pvVar3;
    if (*(long *)(in_RDI + 0x48) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate buf->mvs");
    }
    aom_free(pvVar2);
    pvVar3 = aom_calloc(CONCAT44(iVar5,iVar4),(size_t)pvVar2);
    *(void **)(in_RDI + 0x50) = pvVar3;
    if (*(long *)(in_RDI + 0x50) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate buf->seg_map");
    }
  }
  iVar1 = (*(int *)((long)pvVar2 + 0xc) + 0x20 >> 1) * (*(int *)((long)pvVar2 + 0x3c) >> 1);
  if ((*(long *)(in_RSI + 0x6358) == 0) || (*(int *)(in_RSI + 0x6360) < iVar1)) {
    aom_free(pvVar2);
    pvVar2 = aom_calloc(CONCAT44(iVar5,iVar4),(size_t)pvVar2);
    *(void **)(in_RSI + 0x6358) = pvVar2;
    if (*(long *)(in_RSI + 0x6358) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate cm->tpl_mvs");
    }
    *(int *)(in_RSI + 0x6360) = iVar1;
  }
  return;
}

Assistant:

static inline void ensure_mv_buffer(RefCntBuffer *buf, AV1_COMMON *cm) {
  const int buf_rows = buf->mi_rows;
  const int buf_cols = buf->mi_cols;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;

  if (buf->mvs == NULL || buf_rows != mi_params->mi_rows ||
      buf_cols != mi_params->mi_cols) {
    aom_free(buf->mvs);
    buf->mi_rows = mi_params->mi_rows;
    buf->mi_cols = mi_params->mi_cols;
    CHECK_MEM_ERROR(cm, buf->mvs,
                    (MV_REF *)aom_calloc(((mi_params->mi_rows + 1) >> 1) *
                                             ((mi_params->mi_cols + 1) >> 1),
                                         sizeof(*buf->mvs)));
    aom_free(buf->seg_map);
    CHECK_MEM_ERROR(
        cm, buf->seg_map,
        (uint8_t *)aom_calloc(mi_params->mi_rows * mi_params->mi_cols,
                              sizeof(*buf->seg_map)));
  }

  const int mem_size =
      ((mi_params->mi_rows + MAX_MIB_SIZE) >> 1) * (mi_params->mi_stride >> 1);

  if (cm->tpl_mvs == NULL || cm->tpl_mvs_mem_size < mem_size) {
    aom_free(cm->tpl_mvs);
    CHECK_MEM_ERROR(cm, cm->tpl_mvs,
                    (TPL_MV_REF *)aom_calloc(mem_size, sizeof(*cm->tpl_mvs)));
    cm->tpl_mvs_mem_size = mem_size;
  }
}